

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void do_find_command_for_selection_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Wrapper *pAVar4;
  Am_Value_List all_cmds;
  Am_Value obj_mod_val;
  Am_Object this_cmd;
  Am_Object menu;
  Am_Value_List cmds_using_objects;
  Am_Object real_cmd;
  Am_Value_List objects;
  Am_Value_List obj_mod_list;
  Am_Value_List AStack_98;
  Am_Value local_88;
  Am_Object local_78;
  Am_Object local_70;
  Am_Value_List local_68;
  Am_Object local_58;
  Am_Value_List local_50;
  Am_Value_List local_40;
  
  Am_Object::Get_Object((Am_Object *)&local_88,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object((Am_Object *)&AStack_98,(Am_Slot_Key)&local_88,10);
  Am_Object::Get_Object((Am_Object *)&local_68,(Am_Slot_Key)&AStack_98,0x197);
  pAVar2 = Am_Object::Get((Am_Object *)&local_68,0x169,0);
  Am_Value_List::Am_Value_List(&local_50,pAVar2);
  Am_Object::~Am_Object((Am_Object *)&local_68);
  Am_Object::~Am_Object((Am_Object *)&AStack_98);
  Am_Object::~Am_Object((Am_Object *)&local_88);
  Am_Value_List::Am_Value_List(&local_68);
  Am_Object::Get_Object((Am_Object *)&AStack_98,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Sibling(&local_70,(Am_Slot_Key)&AStack_98,(ulong)Am_UNDO_SCROLL_GROUP);
  Am_Object::~Am_Object((Am_Object *)&AStack_98);
  pAVar2 = Am_Object::Get(&local_70,0xa2,0);
  Am_Value_List::Am_Value_List(&AStack_98,pAVar2);
  local_78.data = (Am_Object_Data *)0x0;
  local_58.data = (Am_Object_Data *)0x0;
  local_88.type = 0;
  local_88.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Am_Value_List(&local_40);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"selected ",9);
    poVar3 = operator<<((ostream *)&std::cout,&local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," all commands ",0xe);
    poVar3 = operator<<(poVar3,&AStack_98);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::ostream::flush();
  }
  Am_Value_List::Start(&AStack_98);
  do {
    bVar1 = Am_Value_List::Last(&AStack_98);
    if (bVar1) {
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_68);
      Am_Object::Set(&local_70,0x169,pAVar4,0);
      Am_Value_List::~Am_Value_List(&local_40);
      Am_Value::~Am_Value(&local_88);
      Am_Object::~Am_Object(&local_58);
      Am_Object::~Am_Object(&local_78);
      Am_Value_List::~Am_Value_List(&AStack_98);
      Am_Object::~Am_Object(&local_70);
      Am_Value_List::~Am_Value_List(&local_68);
      Am_Value_List::~Am_Value_List(&local_50);
      return;
    }
    pAVar2 = Am_Value_List::Get(&AStack_98);
    Am_Object::operator=(&local_78,pAVar2);
    pAVar2 = Am_Object::Get(&local_78,0x153,0);
    Am_Object::operator=(&local_58,pAVar2);
    pAVar2 = Am_Object::Get(&local_58,0x16d,0);
    Am_Value::operator=(&local_88,pAVar2);
    if (am_sdebug == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  for cmd ",10);
      poVar3 = operator<<((ostream *)&std::cout,&local_78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," real ",6);
      poVar3 = operator<<(poVar3,&local_58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," obj mod ",9);
      poVar3 = operator<<(poVar3,&local_88);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::ostream::flush();
    }
    bVar1 = Am_Value::Valid(&local_88);
    if (bVar1) {
      if (local_88.type == 0xa001) {
        Am_Value_List::Make_Empty(&local_40);
        Am_Value_List::Add(&local_40,&local_88,Am_TAIL,true);
      }
      else {
        bVar1 = Am_Value_List::Test(&local_88);
        if (!bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Object Modified of ",0x13);
          poVar3 = operator<<((ostream *)&std::cerr,&local_78);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not list or obj ",0x14);
          poVar3 = operator<<(poVar3,&local_88);
          std::endl<char,std::char_traits<char>>(poVar3);
          Am_Error();
        }
        Am_Value_List::operator=(&local_40,&local_88);
      }
      bVar1 = any_list_member(&local_50,&local_40);
      if (bVar1) {
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_78);
        Am_Value_List::Add(&local_68,pAVar4,Am_TAIL,true);
      }
    }
    Am_Value_List::Next(&AStack_98);
  } while( true );
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_find_command_for_selection,
                 (Am_Object cmd))
{
  Am_Value_List objects = cmd.Get_Object(Am_SAVED_OLD_OWNER)
                              .Get_Owner()
                              .Get_Object(Am_SELECTION_WIDGET)
                              .Get(Am_VALUE);
  Am_Value_List cmds_using_objects;
  Am_Object menu =
      cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Sibling(Am_UNDO_SCROLL_GROUP);
  Am_Value_List all_cmds = menu.Get(Am_ITEMS);
  Am_Object this_cmd, real_cmd;
  Am_Value obj_mod_val;
  Am_Value_List obj_mod_list;
  if (am_sdebug)
    std::cout << "selected " << objects << " all commands " << all_cmds
              << std::endl
              << std::flush;
  for (all_cmds.Start(); !all_cmds.Last(); all_cmds.Next()) {
    this_cmd = all_cmds.Get();
    real_cmd = this_cmd.Get(Am_ID);
    obj_mod_val = real_cmd.Get(Am_OBJECT_MODIFIED);
    if (am_sdebug)
      std::cout << "  for cmd " << this_cmd << " real " << real_cmd
                << " obj mod " << obj_mod_val << std::endl
                << std::flush;
    if (obj_mod_val.Valid()) {
      if (obj_mod_val.type == Am_OBJECT) {
        obj_mod_list.Make_Empty();
        obj_mod_list.Add(obj_mod_val);
      } else if (Am_Value_List::Test(obj_mod_val)) {
        obj_mod_list = obj_mod_val;
      } else
        Am_ERROR("Object Modified of " << this_cmd << " is not list or obj "
                                       << obj_mod_val);
      if (any_list_member(objects, obj_mod_list))
        cmds_using_objects.Add(this_cmd);
    }
  }
  menu.Set(Am_VALUE, cmds_using_objects);
}